

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction_util.cpp
# Opt level: O3

void AddInputs(CMutableTransaction *rawTx,UniValue *inputs_in,optional<bool> rbf)

{
  COutPoint prevoutIn;
  uint32_t uVar1;
  UniValue *pUVar2;
  UniValue *this;
  ulong uVar3;
  undefined6 in_register_00000012;
  undefined4 uVar4;
  uint uVar5;
  size_t index;
  long in_FS_OFFSET;
  string_view key;
  string_view key_00;
  string_view strKey;
  Txid txid;
  undefined4 in_stack_fffffffffffffe70;
  undefined1 local_140 [8];
  undefined1 auStack_138 [8];
  undefined1 local_130 [8];
  undefined1 auStack_128 [16];
  undefined1 local_118 [24];
  undefined1 auStack_100 [40];
  vector<UniValue,_std::allocator<UniValue>_> local_d8;
  undefined8 uStack_c0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  uchar auStack_9f [15];
  UniValue local_90;
  long local_38;
  
  uVar3 = CONCAT62(in_register_00000012,
                   rbf.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool>) & 0xffffffff;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.val._M_dataplus._M_p = (pointer)&local_90.val.field_2;
  local_90.val._M_string_length = 0;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.typ = VNULL;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (inputs_in->typ == VNULL) {
    local_b0 = &local_a0;
    local_140._0_4_ = 2;
    auStack_128[0] = '\0';
    auStack_128._1_7_ = auStack_9f._0_7_;
    local_130 = (undefined1  [8])0x0;
    local_a8 = 0;
    local_a0 = 0;
    local_118._0_8_ = (char *)0x0;
    local_118._8_8_ = 0;
    local_118._16_8_ = 0;
    auStack_100._0_8_ = (pointer)0x0;
    auStack_100._8_8_ = (pointer)0x0;
    auStack_100._16_8_ = (pointer)0x0;
    local_90.typ = VARR;
    auStack_138 = (undefined1  [8])(local_130 + 8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_90.val,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_138);
    local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         (pointer)local_90.keys.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)local_90.keys.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
    local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)local_90.keys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_118._16_8_;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118._0_8_;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_118._8_8_;
    local_118._0_8_ = (char *)0x0;
    local_118._8_8_ = 0;
    local_118._16_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_d8);
    local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
    ._M_start = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)auStack_100._16_8_;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)auStack_100._0_8_;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)auStack_100._8_8_;
    auStack_100._0_8_ = (pointer)0x0;
    auStack_100._8_8_ = (pointer)0x0;
    auStack_100._16_8_ = (pointer)0x0;
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_d8);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)auStack_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_118);
    if (auStack_138 != (undefined1  [8])(local_130 + 8)) {
      operator_delete((void *)auStack_138,CONCAT71(auStack_128._1_7_,auStack_128[0]) + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(auStack_9f._0_7_,local_a0) + 1);
    }
  }
  else {
    pUVar2 = UniValue::get_array(inputs_in);
    local_90.typ = pUVar2->typ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_90.val,&pUVar2->val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_90.keys,&pUVar2->keys);
    std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&local_90.values,&pUVar2->values);
  }
  if (local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = (undefined4)
            CONCAT71((int7)(uVar3 >> 8),
                     (byte)uVar3 |
                     ((uint)CONCAT62(in_register_00000012,
                                     rbf.super__Optional_base<bool,_true,_true>._M_payload.
                                     super__Optional_payload_base<bool>) >> 8 & 1) == 0);
    uVar5 = 1;
    index = 0;
    do {
      pUVar2 = UniValue::operator[](&local_90,index);
      pUVar2 = UniValue::get_obj(pUVar2);
      strKey._M_str = "txid";
      strKey._M_len = 4;
      ParseHashO((uint256 *)local_140,pUVar2,strKey);
      uStack_c0 = CONCAT71(auStack_128._1_7_,auStack_128[0]);
      local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_130;
      local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_140;
      local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)auStack_138;
      key._M_str = "vout";
      key._M_len = 4;
      this = UniValue::find_value(pUVar2,key);
      if (this->typ != VNUM) {
        pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
        local_140 = (undefined1  [8])local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_140,"Invalid parameter, missing vout key","");
        JSONRPCError(pUVar2,-8,(string *)local_140);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00d8720a;
      }
      uVar1 = UniValue::getInt<int>(this);
      if ((int)uVar1 < 0) {
        pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
        local_140 = (undefined1  [8])local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_140,"Invalid parameter, vout cannot be negative","");
        JSONRPCError(pUVar2,-8,(string *)local_140);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00d8720a;
      }
      key_00._M_str = "sequence";
      key_00._M_len = 8;
      pUVar2 = UniValue::find_value(pUVar2,key_00);
      if ((pUVar2->typ == VNUM) && (uVar3 = UniValue::getInt<long>(pUVar2), uVar3 >> 0x20 != 0)) {
        pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
        local_140 = (undefined1  [8])local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_140,"Invalid parameter, sequence number is out of range","");
        JSONRPCError(pUVar2,-8,(string *)local_140);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00d8720a;
      }
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           local_d8.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = (undefined1)uStack_c0;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = uStack_c0._1_1_;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = uStack_c0._2_1_;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = uStack_c0._3_1_;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = uStack_c0._4_1_;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = uStack_c0._5_1_;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = uStack_c0._6_1_;
      prevoutIn.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = uStack_c0._7_1_;
      prevoutIn.n = uVar1;
      CTxIn::CTxIn((CTxIn *)local_140,prevoutIn,
                   (CScript)ZEXT832(CONCAT44(uVar4,in_stack_fffffffffffffe70)),
                   (uint32_t)&stack0xfffffffffffffe78);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::push_back(&rawTx->vin,(CTxIn *)local_140);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)(auStack_100 + 0x10));
      if (0x1c < (uint)auStack_100._4_4_) {
        free((void *)local_118._0_8_);
      }
      index = (size_t)uVar5;
      uVar3 = ((long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      uVar5 = uVar5 + 1;
    } while (index <= uVar3 && uVar3 - index != 0);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00d8720a:
  __stack_chk_fail();
}

Assistant:

void AddInputs(CMutableTransaction& rawTx, const UniValue& inputs_in, std::optional<bool> rbf)
{
    UniValue inputs;
    if (inputs_in.isNull()) {
        inputs = UniValue::VARR;
    } else {
        inputs = inputs_in.get_array();
    }

    for (unsigned int idx = 0; idx < inputs.size(); idx++) {
        const UniValue& input = inputs[idx];
        const UniValue& o = input.get_obj();

        Txid txid = Txid::FromUint256(ParseHashO(o, "txid"));

        const UniValue& vout_v = o.find_value("vout");
        if (!vout_v.isNum())
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, missing vout key");
        int nOutput = vout_v.getInt<int>();
        if (nOutput < 0)
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, vout cannot be negative");

        uint32_t nSequence;

        if (rbf.value_or(true)) {
            nSequence = MAX_BIP125_RBF_SEQUENCE; /* CTxIn::SEQUENCE_FINAL - 2 */
        } else if (rawTx.nLockTime) {
            nSequence = CTxIn::MAX_SEQUENCE_NONFINAL; /* CTxIn::SEQUENCE_FINAL - 1 */
        } else {
            nSequence = CTxIn::SEQUENCE_FINAL;
        }

        // set the sequence number if passed in the parameters object
        const UniValue& sequenceObj = o.find_value("sequence");
        if (sequenceObj.isNum()) {
            int64_t seqNr64 = sequenceObj.getInt<int64_t>();
            if (seqNr64 < 0 || seqNr64 > CTxIn::SEQUENCE_FINAL) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid parameter, sequence number is out of range");
            } else {
                nSequence = (uint32_t)seqNr64;
            }
        }

        CTxIn in(COutPoint(txid, nOutput), CScript(), nSequence);

        rawTx.vin.push_back(in);
    }
}